

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int alloc_vprintf(char **out_buf,char *prealloc_buf,size_t prealloc_size,char *fmt,__va_list_tag *ap
                 )

{
  char *pcVar1;
  int local_5c;
  undefined1 auStack_58 [4];
  int len;
  va_list ap_copy;
  __va_list_tag *ap_local;
  char *fmt_local;
  size_t prealloc_size_local;
  char *prealloc_buf_local;
  char **out_buf_local;
  
  ap_copy[0].overflow_arg_area = ap->reg_save_area;
  auStack_58 = ap->gp_offset;
  unique0x10000119 = ap->fp_offset;
  ap_copy[0]._0_8_ = ap->overflow_arg_area;
  local_5c = vsnprintf((char *)0x0,0,fmt,auStack_58);
  if (local_5c < 0) {
    ap_copy[0].overflow_arg_area = ap->reg_save_area;
    auStack_58 = ap->gp_offset;
    unique0x10000139 = ap->fp_offset;
    ap_copy[0]._0_8_ = ap->overflow_arg_area;
    local_5c = alloc_vprintf2(out_buf,fmt,(__va_list_tag *)auStack_58);
  }
  else if ((ulong)(long)local_5c < prealloc_size) {
    ap_copy[0].overflow_arg_area = ap->reg_save_area;
    auStack_58 = ap->gp_offset;
    unique0x10000179 = ap->fp_offset;
    ap_copy[0]._0_8_ = ap->overflow_arg_area;
    vsnprintf(prealloc_buf,prealloc_size,fmt,auStack_58);
    *out_buf = prealloc_buf;
  }
  else {
    pcVar1 = (char *)mg_malloc((long)local_5c + 1);
    *out_buf = pcVar1;
    if (*out_buf == (char *)0x0) {
      return -1;
    }
    ap_copy[0].overflow_arg_area = ap->reg_save_area;
    auStack_58 = ap->gp_offset;
    unique0x10000159 = ap->fp_offset;
    ap_copy[0]._0_8_ = ap->overflow_arg_area;
    vsnprintf(*out_buf,(long)local_5c + 1,fmt,auStack_58);
  }
  return local_5c;
}

Assistant:

static int
alloc_vprintf(char **out_buf,
              char *prealloc_buf,
              size_t prealloc_size,
              const char *fmt,
              va_list ap)
{
	va_list ap_copy;
	int len;

	/* Windows is not standard-compliant, and vsnprintf() returns -1 if
	 * buffer is too small. Also, older versions of msvcrt.dll do not have
	 * _vscprintf().  However, if size is 0, vsnprintf() behaves correctly.
	 * Therefore, we make two passes: on first pass, get required message
	 * length.
	 * On second pass, actually print the message. */
	va_copy(ap_copy, ap);
	len = vsnprintf_impl(NULL, 0, fmt, ap_copy);
	va_end(ap_copy);

	if (len < 0) {
		/* C runtime is not standard compliant, vsnprintf() returned -1.
		 * Switch to alternative code path that uses incremental
		 * allocations.
		 */
		va_copy(ap_copy, ap);
		len = alloc_vprintf2(out_buf, fmt, ap_copy);
		va_end(ap_copy);

	} else if ((size_t)(len) >= prealloc_size) {
		/* The pre-allocated buffer not large enough. */
		/* Allocate a new buffer. */
		*out_buf = (char *)mg_malloc((size_t)(len) + 1);
		if (!*out_buf) {
			/* Allocation failed. Return -1 as "out of memory" error. */
			return -1;
		}
		/* Buffer allocation successful. Store the string there. */
		va_copy(ap_copy, ap);
		IGNORE_UNUSED_RESULT(
		    vsnprintf_impl(*out_buf, (size_t)(len) + 1, fmt, ap_copy));
		va_end(ap_copy);

	} else {
		/* The pre-allocated buffer is large enough.
		 * Use it to store the string and return the address. */
		va_copy(ap_copy, ap);
		IGNORE_UNUSED_RESULT(
		    vsnprintf_impl(prealloc_buf, prealloc_size, fmt, ap_copy));
		va_end(ap_copy);
		*out_buf = prealloc_buf;
	}

	return len;
}